

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O3

FreeFn __thiscall Js::JavascriptArrayBuffer::GetArrayBufferFreeFn(JavascriptArrayBuffer *this)

{
  return free;
}

Assistant:

ArrayBuffer::FreeFn JavascriptArrayBuffer::GetArrayBufferFreeFn()
    {
#if ENABLE_FAST_ARRAYBUFFER
        if (IsValidVirtualBufferLength(bufferLength))
        {
            return FreeMemAlloc;
        }
        else
#endif
        {
            return free;
        }
    }